

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void upb_MtDecoder_PushOneof(upb_MtDecoder *d,upb_OneOfLayoutItem item)

{
  size_t sVar1;
  upb_OneOfLayoutItem uVar2;
  upb_OneOfLayoutItem *puVar3;
  long local_28;
  size_t new_cap;
  upb_MtDecoder *d_local;
  upb_OneOfLayoutItem item_local;
  
  d_local._4_2_ = item.field_index;
  if (d_local._4_2_ == 0xffff) {
    upb_MdDecoder_ErrorJmp(&d->base,"Empty oneof");
  }
  if ((d->oneofs).buf_capacity_bytes < ((d->oneofs).size + 1) * 4) {
    if ((d->oneofs).size * 2 < 8) {
      local_28 = 8;
    }
    else {
      local_28 = (d->oneofs).size << 1;
    }
    puVar3 = (upb_OneOfLayoutItem *)
             upb_grealloc((d->oneofs).data,(d->oneofs).buf_capacity_bytes,local_28 << 2);
    (d->oneofs).data = puVar3;
    upb_MdDecoder_CheckOutOfMemory(&d->base,(d->oneofs).data);
    (d->oneofs).buf_capacity_bytes = local_28 << 2;
  }
  d_local._4_4_ = (upb_OneOfLayoutItem)CONCAT22(item._2_2_,d_local._4_2_ - 3);
  uVar2 = d_local._4_4_;
  d->rep_counts_offsets[1] = d->rep_counts_offsets[1] + 1;
  d_local._6_1_ = item.rep;
  d->rep_counts_offsets[d_local._6_1_] = d->rep_counts_offsets[d_local._6_1_] + 1;
  sVar1 = (d->oneofs).size;
  (d->oneofs).size = sVar1 + 1;
  (d->oneofs).data[sVar1] = uVar2;
  return;
}

Assistant:

static void upb_MtDecoder_PushOneof(upb_MtDecoder* d,
                                    upb_OneOfLayoutItem item) {
  if (item.field_index == kUpb_OneOfLayoutItem_IndexSentinel) {
    upb_MdDecoder_ErrorJmp(&d->base, "Empty oneof");
  }
  if ((d->oneofs.size + 1) * sizeof(*d->oneofs.data) >
      d->oneofs.buf_capacity_bytes) {
    size_t new_cap = UPB_MAX(8, d->oneofs.size * 2) * sizeof(*d->oneofs.data);
    d->oneofs.data =
        upb_grealloc(d->oneofs.data, d->oneofs.buf_capacity_bytes, new_cap);
    upb_MdDecoder_CheckOutOfMemory(&d->base, d->oneofs.data);
    d->oneofs.buf_capacity_bytes = new_cap;
  }
  item.field_index -= kOneofBase;

  d->rep_counts_offsets[kUpb_OneOf_CaseFieldRep]++;
  d->rep_counts_offsets[item.rep]++;
  d->oneofs.data[d->oneofs.size++] = item;
}